

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date.cpp
# Opt level: O1

string * duckdb::Date::FormatError(string *__return_storage_ptr__,string *str)

{
  pointer pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  string local_60;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  local_40[0] = local_30;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,"invalid date field format: \"%s\", expected format is (YYYY-MM-DD)"
             ,"");
  pcVar1 = (str->_M_dataplus)._M_p;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar1,pcVar1 + str->_M_string_length);
  StringUtil::Format<std::__cxx11::string>
            (__return_storage_ptr__,(StringUtil *)local_40,&local_60,in_RCX);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if (local_40[0] != local_30) {
    operator_delete(local_40[0]);
  }
  return __return_storage_ptr__;
}

Assistant:

string Date::FormatError(const string &str) {
	return StringUtil::Format("invalid date field format: \"%s\", "
	                          "expected format is (YYYY-MM-DD)",
	                          str);
}